

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O0

int __thiscall
re2::ToStringWalker::PostVisit
          (ToStringWalker *this,Regexp *re,int parent_arg,int pre_arg,int *child_args,
          int nchild_args)

{
  ulong uVar1;
  bool bVar2;
  RegexpOp RVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ParseFlags PVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  ostream *poVar11;
  CharClass *pCVar12;
  iterator pRVar13;
  int in_EDX;
  Regexp *in_RSI;
  long in_RDI;
  iterator i_1;
  CharClass *cc;
  int i;
  int prec;
  Rune in_stack_fffffffffffffd18;
  undefined1 foldcase;
  Rune in_stack_fffffffffffffd1c;
  string *in_stack_fffffffffffffd20;
  LogMessage *in_stack_fffffffffffffd30;
  iterator pRVar14;
  CharClass *in_stack_fffffffffffffd50;
  string *psVar15;
  char *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  iterator local_230;
  CharClass *local_228;
  string local_220 [32];
  string local_200 [8];
  string local_1e0 [48];
  LogMessage local_1b0;
  int local_2c;
  int local_28;
  Regexp *local_10;
  
  local_28 = in_EDX;
  local_10 = in_RSI;
  RVar3 = Regexp::op(in_RSI);
  if (RVar3 - kRegexpNoMatch < 0x14 || RVar3 == kMaxRegexpOp) {
    switch((long)&switchD_0025122b::switchdataD_0055c4d8 +
           (long)(int)(&switchD_0025122b::switchdataD_0055c4d8)[RVar3 - kRegexpNoMatch]) {
    case 0x25122d:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      break;
    case 0x25124a:
      if (local_28 < 4) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      break;
    case 0x251271:
      Regexp::rune(local_10);
      foldcase = (undefined1)((uint)in_stack_fffffffffffffd18 >> 0x18);
      PVar7 = Regexp::parse_flags(local_10);
      operator&(PVar7,FoldCase);
      AppendLiteral(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,(bool)foldcase);
      break;
    case 0x2512d7:
      for (local_2c = 0; iVar8 = local_2c, iVar5 = Regexp::nrunes(local_10), iVar8 < iVar5;
          local_2c = local_2c + 1) {
        Regexp::runes(local_10);
        PVar7 = Regexp::parse_flags(local_10);
        operator&(PVar7,FoldCase);
        AppendLiteral(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,
                      SUB41((uint)in_stack_fffffffffffffd18 >> 0x18,0));
      }
      if (local_28 < 2) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      break;
    case 0x2513b7:
      if (local_28 < 2) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      break;
    case 0x2513de:
      uVar1 = *(ulong *)(in_RDI + 0x18);
      std::__cxx11::string::size();
      iVar8 = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
      pcVar9 = (char *)std::__cxx11::string::operator[](uVar1);
      if (*pcVar9 == '|') {
        uVar1 = *(ulong *)(in_RDI + 0x18);
        lVar10 = std::__cxx11::string::size();
        std::__cxx11::string::erase(uVar1,lVar10 - 1);
      }
      else {
        LogMessage::LogMessage
                  ((LogMessage *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                   in_stack_fffffffffffffd58,iVar8);
        poVar11 = LogMessage::stream(&local_1b0);
        poVar11 = std::operator<<(poVar11,"Bad final char: ");
        std::ostream::operator<<(poVar11,*(void **)(in_RDI + 0x18));
        LogMessage::~LogMessage(in_stack_fffffffffffffd30);
      }
      if (local_28 < 3) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      break;
    case 0x251509:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      PVar7 = Regexp::parse_flags(local_10);
      PVar7 = operator&(PVar7,NonGreedy);
      if (PVar7 != NoParseFlags) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      if (local_28 < 1) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      break;
    case 0x25157e:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      PVar7 = Regexp::parse_flags(local_10);
      PVar7 = operator&(PVar7,NonGreedy);
      if (PVar7 != NoParseFlags) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      if (local_28 < 1) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      break;
    case 0x2515f3:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      PVar7 = Regexp::parse_flags(local_10);
      PVar7 = operator&(PVar7,NonGreedy);
      if (PVar7 != NoParseFlags) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      if (local_28 < 1) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      break;
    case 0x251668:
      iVar8 = Regexp::max(local_10);
      if (iVar8 == -1) {
        psVar15 = *(string **)(in_RDI + 0x18);
        uVar4 = Regexp::min(local_10);
        StringPrintf_abi_cxx11_((char *)local_1e0,"{%d,}",(ulong)uVar4);
        std::__cxx11::string::append(psVar15);
        std::__cxx11::string::~string(local_1e0);
      }
      else {
        iVar8 = Regexp::min(local_10);
        iVar5 = Regexp::max(local_10);
        if (iVar8 == iVar5) {
          psVar15 = *(string **)(in_RDI + 0x18);
          uVar4 = Regexp::min(local_10);
          StringPrintf_abi_cxx11_((char *)local_200,"{%d}",(ulong)uVar4);
          std::__cxx11::string::append(psVar15);
          std::__cxx11::string::~string(local_200);
        }
        else {
          psVar15 = *(string **)(in_RDI + 0x18);
          uVar4 = Regexp::min(local_10);
          uVar6 = Regexp::max(local_10);
          StringPrintf_abi_cxx11_((char *)local_220,"{%d,%d}",(ulong)uVar4,(ulong)uVar6);
          std::__cxx11::string::append(psVar15);
          std::__cxx11::string::~string(local_220);
        }
      }
      PVar7 = Regexp::parse_flags(local_10);
      PVar7 = operator&(PVar7,NonGreedy);
      if (PVar7 != NoParseFlags) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      if (local_28 < 1) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      break;
    case 0x2518a7:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      break;
    case 0x2518c4:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      break;
    case 0x2518e1:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      break;
    case 0x2518fe:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      break;
    case 0x25191b:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      break;
    case 0x251938:
      PVar7 = Regexp::parse_flags(local_10);
      PVar7 = operator&(PVar7,WasDollar);
      if (PVar7 == NoParseFlags) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      else {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      break;
    case 0x25198d:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      break;
    case 0x2519aa:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      break;
    case 0x2519c7:
      pCVar12 = Regexp::cc(local_10);
      iVar8 = CharClass::size(pCVar12);
      if (iVar8 == 0) {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      else {
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
        local_228 = Regexp::cc(local_10);
        bVar2 = CharClass::Contains(local_228,0xfffe);
        if ((bVar2) && (bVar2 = CharClass::full(local_228), !bVar2)) {
          local_228 = CharClass::Negate(in_stack_fffffffffffffd50);
          std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
        }
        local_230 = CharClass::begin(local_228);
        while (pRVar14 = local_230, pRVar13 = CharClass::end(local_228), pRVar14 != pRVar13) {
          AppendCCRange(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,
                        in_stack_fffffffffffffd18);
          local_230 = local_230 + 1;
        }
        pCVar12 = Regexp::cc(local_10);
        if (local_228 != pCVar12) {
          CharClass::Delete((CharClass *)in_stack_fffffffffffffd20);
        }
        std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      }
      break;
    case 0x251b4a:
      std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
      break;
    case 0x251b64:
      pcVar9 = *(char **)(in_RDI + 0x18);
      Regexp::match_id(local_10);
      std::__cxx11::string::append(pcVar9,0x55c640);
    }
  }
  if (local_28 == 3) {
    std::__cxx11::string::append(*(char **)(in_RDI + 0x18));
  }
  return 0;
}

Assistant:

int ToStringWalker::PostVisit(Regexp* re, int parent_arg, int pre_arg,
                              int* child_args, int nchild_args) {
  int prec = parent_arg;
  switch (re->op()) {
    case kRegexpNoMatch:
      // There's no simple symbol for "no match", but
      // [^0-Runemax] excludes everything.
      t_->append("[^\\x00-\\x{10ffff}]");
      break;

    case kRegexpEmptyMatch:
      // Append (?:) to make empty string visible,
      // unless this is already being parenthesized.
      if (prec < PrecEmpty)
        t_->append("(?:)");
      break;

    case kRegexpLiteral:
      AppendLiteral(t_, re->rune(),
                    (re->parse_flags() & Regexp::FoldCase) != 0);
      break;

    case kRegexpLiteralString:
      for (int i = 0; i < re->nrunes(); i++)
        AppendLiteral(t_, re->runes()[i],
                      (re->parse_flags() & Regexp::FoldCase) != 0);
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpConcat:
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpAlternate:
      // Clumsy but workable: the children all appended |
      // at the end of their strings, so just remove the last one.
      if ((*t_)[t_->size()-1] == '|')
        t_->erase(t_->size()-1);
      else
        LOG(DFATAL) << "Bad final char: " << t_;
      if (prec < PrecAlternate)
        t_->append(")");
      break;

    case kRegexpStar:
      t_->append("*");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpPlus:
      t_->append("+");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpQuest:
      t_->append("?");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpRepeat:
      if (re->max() == -1)
        t_->append(StringPrintf("{%d,}", re->min()));
      else if (re->min() == re->max())
        t_->append(StringPrintf("{%d}", re->min()));
      else
        t_->append(StringPrintf("{%d,%d}", re->min(), re->max()));
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpAnyChar:
      t_->append(".");
      break;

    case kRegexpAnyByte:
      t_->append("\\C");
      break;

    case kRegexpBeginLine:
      t_->append("^");
      break;

    case kRegexpEndLine:
      t_->append("$");
      break;

    case kRegexpBeginText:
      t_->append("(?-m:^)");
      break;

    case kRegexpEndText:
      if (re->parse_flags() & Regexp::WasDollar)
        t_->append("(?-m:$)");
      else
        t_->append("\\z");
      break;

    case kRegexpWordBoundary:
      t_->append("\\b");
      break;

    case kRegexpNoWordBoundary:
      t_->append("\\B");
      break;

    case kRegexpCharClass: {
      if (re->cc()->size() == 0) {
        t_->append("[^\\x00-\\x{10ffff}]");
        break;
      }
      t_->append("[");
      // Heuristic: show class as negated if it contains the
      // non-character 0xFFFE and yet somehow isn't full.
      CharClass* cc = re->cc();
      if (cc->Contains(0xFFFE) && !cc->full()) {
        cc = cc->Negate();
        t_->append("^");
      }
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i)
        AppendCCRange(t_, i->lo, i->hi);
      if (cc != re->cc())
        cc->Delete();
      t_->append("]");
      break;
    }

    case kRegexpCapture:
      t_->append(")");
      break;

    case kRegexpHaveMatch:
      // There's no syntax accepted by the parser to generate
      // this node (it is generated by RE2::Set) so make something
      // up that is readable but won't compile.
      t_->append("(?HaveMatch:%d)", re->match_id());
      break;
  }

  // If the parent is an alternation, append the | for it.
  if (prec == PrecAlternate)
    t_->append("|");

  return 0;
}